

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTimestepper.h
# Opt level: O2

void __thiscall
chrono::ChTimestepperTrapezoidal::ChTimestepperTrapezoidal
          (ChTimestepperTrapezoidal *this,ChIntegrableIIorder *intgr)

{
  ChTimestepperIIorder::ChTimestepperIIorder(&this->super_ChTimestepperIIorder,intgr);
  ChImplicitIterativeTimestepper::ChImplicitIterativeTimestepper
            (&this->super_ChImplicitIterativeTimestepper);
  (this->super_ChTimestepperIIorder).super_ChTimestepper._vptr_ChTimestepper =
       (_func_int **)&PTR__ChTimestepperTrapezoidal_0118f678;
  (this->super_ChImplicitIterativeTimestepper)._vptr_ChImplicitIterativeTimestepper =
       (_func_int **)&PTR__ChTimestepperTrapezoidal_0118f6f8;
  ChStateDelta::ChStateDelta(&this->Dv,(ChIntegrable *)0x0);
  (this->Dl).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->Dl).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  ChState::ChState(&this->Xnew,(ChIntegrable *)0x0);
  ChStateDelta::ChStateDelta(&this->Vnew,(ChIntegrable *)0x0);
  (this->Rold).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->Rold).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  (this->Qc).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->Qc).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  (this->R).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->R).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  (this->Rold).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->Rold).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  return;
}

Assistant:

virtual Type GetType() const override { return Type::TRAPEZOIDAL; }